

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void setJoinExpr(Expr *p,int iTable)

{
  Expr *pEStack_10;
  int iTable_local;
  Expr *p_local;
  
  for (pEStack_10 = p; pEStack_10 != (Expr *)0x0; pEStack_10 = pEStack_10->pRight) {
    pEStack_10->flags = pEStack_10->flags | 1;
    pEStack_10->iRightJoinTable = (i16)iTable;
    setJoinExpr(pEStack_10->pLeft,iTable);
  }
  return;
}

Assistant:

static void setJoinExpr(Expr *p, int iTable){
  while( p ){
    ExprSetProperty(p, EP_FromJoin);
    assert( !ExprHasAnyProperty(p, EP_TokenOnly|EP_Reduced) );
    ExprSetIrreducible(p);
    p->iRightJoinTable = (i16)iTable;
    setJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}